

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR reparse_path_expr(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,uint32_t depth)

{
  lyxp_token lVar1;
  lyxp_token *plVar2;
  LY_ERR ret__;
  LY_ERR LVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  size_t sVar8;
  char *pcVar9;
  LY_ERR ret___3;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  uint local_54;
  uint local_50;
  char *local_48;
  
  uVar7 = *tok_idx;
  if (exp->used == uVar7) {
    LVar3 = LY_EVALID;
    goto LAB_001a858d;
  }
  switch(exp->tokens[uVar7]) {
  case LYXP_TOKEN_PAR1:
    *tok_idx = uVar7 + 1;
    LVar3 = reparse_or_expr(ctx,exp,tok_idx,depth);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    LVar3 = lyxp_check_token(ctx,exp,*tok_idx,LYXP_TOKEN_PAR2);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    uVar7 = *tok_idx;
  case LYXP_TOKEN_VARREF:
  case LYXP_TOKEN_LITERAL:
  case LYXP_TOKEN_NUMBER:
    *tok_idx = uVar7 + 1;
LAB_001a873f:
    while( true ) {
      uVar7 = *tok_idx;
      if (exp->used == uVar7) {
        return LY_SUCCESS;
      }
      if (exp->tokens[uVar7] != LYXP_TOKEN_BRACK1) break;
      LVar3 = reparse_predicate(ctx,exp,tok_idx,depth);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    if ((exp->tokens[uVar7] & ~LYXP_TOKEN_PAR1) != LYXP_TOKEN_OPER_PATH) {
      return LY_SUCCESS;
    }
    *tok_idx = uVar7 + 1;
    goto switchD_001a85d8_caseD_5;
  default:
    pcVar6 = lyxp_token2str(exp->tokens[uVar7]);
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").",pcVar6,
            exp->expr + exp->tok_pos[*tok_idx]);
    return LY_EVALID;
  case LYXP_TOKEN_DOT:
  case LYXP_TOKEN_DDOT:
  case LYXP_TOKEN_AT:
  case LYXP_TOKEN_NAMETEST:
  case LYXP_TOKEN_NODETYPE:
  case LYXP_TOKEN_AXISNAME:
    goto switchD_001a85d8_caseD_5;
  case LYXP_TOKEN_FUNCNAME:
    LVar3 = lyxp_check_token(ctx,exp,uVar7,LYXP_TOKEN_FUNCNAME);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    break;
  case LYXP_TOKEN_OPER_PATH:
  case LYXP_TOKEN_OPER_RPATH:
    LVar3 = exp_check_token2(ctx,exp,uVar7,LYXP_TOKEN_OPER_PATH,LYXP_TOKEN_OPER_RPATH);
    if (LVar3 != LY_SUCCESS) {
      return LVar3;
    }
    plVar2 = exp->tokens;
    uVar7 = *tok_idx + 1;
    lVar1 = plVar2[*tok_idx];
    *tok_idx = uVar7;
    if (lVar1 == LYXP_TOKEN_OPER_PATH) {
      if (exp->used == uVar7) {
        return LY_SUCCESS;
      }
      lVar1 = plVar2[uVar7];
      if (LYXP_TOKEN_AXISNAME < lVar1) {
        return LY_SUCCESS;
      }
      if ((0x400ce0U >> (lVar1 & (LYXP_TOKEN_NUMBER|LYXP_TOKEN_AT)) & 1) == 0) {
        return LY_SUCCESS;
      }
    }
switchD_001a85d8_caseD_5:
    LVar3 = reparse_relative_location_path(ctx,exp,tok_idx,depth);
    if (LVar3 == LY_SUCCESS) {
      return LY_SUCCESS;
    }
    return LVar3;
  }
  uVar7 = *tok_idx;
  uVar5 = exp->tok_len[uVar7];
  pcVar6 = exp->expr;
  uVar11 = (ulong)exp->tok_pos[uVar7];
  switch(uVar5) {
  case 3:
    if (pcVar6[uVar11] == 's') {
      if (pcVar6[uVar11 + 1] != 'u') goto switchD_001a8698_caseD_e;
      bVar12 = pcVar6[uVar11 + 2] == 'm';
    }
    else {
      if ((pcVar6[uVar11] != 'n') || (pcVar6[uVar11 + 1] != 'o')) goto switchD_001a8698_caseD_e;
      bVar12 = pcVar6[uVar11 + 2] == 't';
    }
    local_54 = 1;
    local_50 = 1;
    if (!bVar12) goto switchD_001a8698_caseD_e;
    break;
  case 4:
    pcVar9 = pcVar6 + uVar11;
    iVar4 = strncmp(pcVar9,"lang",4);
    local_50 = 1;
    if (iVar4 == 0) {
      local_54 = 1;
    }
    else {
      iVar4 = strncmp(pcVar9,"last",4);
      local_54 = 0;
      if (iVar4 == 0) {
LAB_001a8bef:
        local_54 = 0;
        local_50 = 0;
      }
      else {
        iVar4 = strncmp(pcVar9,"name",4);
        if (iVar4 != 0) {
          iVar4 = strncmp(pcVar9,"true",4);
          local_50 = 0;
          goto LAB_001a897a;
        }
      }
    }
    break;
  case 5:
    pcVar9 = pcVar6 + uVar11;
    iVar4 = strncmp(pcVar9,"count",5);
    local_54 = 1;
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar9,"false",5);
      if (iVar4 == 0) goto LAB_001a8bef;
      iVar4 = strncmp(pcVar9,"floor",5);
      if ((iVar4 != 0) && (iVar4 = strncmp(pcVar9,"round",5), iVar4 != 0)) {
        iVar4 = strncmp(pcVar9,"deref",5);
        local_50 = 1;
        goto LAB_001a897a;
      }
    }
LAB_001a8c51:
    local_54 = 1;
    local_50 = 1;
    break;
  case 6:
    iVar4 = strncmp(pcVar6 + uVar11,"concat",6);
    if (iVar4 == 0) {
      local_50 = 0xffffffff;
LAB_001a8c15:
      local_54 = 2;
    }
    else {
      iVar4 = strncmp(pcVar6 + uVar11,"number",6);
      local_50 = 1;
      local_54 = 0;
      if (iVar4 != 0) {
        pcVar9 = "string";
        sVar8 = 6;
        goto LAB_001a8970;
      }
    }
    break;
  case 7:
    pcVar9 = pcVar6 + uVar11;
    iVar4 = strncmp(pcVar9,"boolean",7);
    local_54 = 1;
    if (iVar4 == 0) goto LAB_001a8c51;
    iVar4 = strncmp(pcVar9,"ceiling",7);
    local_50 = 1;
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar9,"current",7);
      if (iVar4 != 0) goto switchD_001a8698_caseD_e;
      goto LAB_001a8bef;
    }
    break;
  case 8:
    pcVar9 = pcVar6 + uVar11;
    iVar4 = strncmp(pcVar9,"contains",8);
    local_54 = 2;
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar9,"position",8);
      if (iVar4 == 0) goto LAB_001a8bef;
      iVar4 = strncmp(pcVar9,"re-match",8);
      local_50 = 2;
LAB_001a897a:
      if (iVar4 != 0) goto switchD_001a8698_caseD_e;
      break;
    }
    goto LAB_001a8bc8;
  case 9:
    iVar4 = strncmp(pcVar6 + uVar11,"substring",9);
    if (iVar4 == 0) {
      local_50 = 3;
      goto LAB_001a8c15;
    }
    iVar4 = strncmp(pcVar6 + uVar11,"translate",9);
    if (iVar4 != 0) goto switchD_001a8698_caseD_e;
    local_54 = 3;
    local_50 = 3;
    break;
  case 10:
    iVar4 = strncmp(pcVar6 + uVar11,"local-name",10);
    if (iVar4 != 0) {
      iVar4 = strncmp(pcVar6 + uVar11,"enum-value",10);
      if (iVar4 != 0) {
        pcVar9 = "bit-is-set";
        sVar8 = 10;
        goto LAB_001a8b89;
      }
      goto LAB_001a8c51;
    }
LAB_001a8bd5:
    local_50 = 1;
    local_54 = 0;
    break;
  case 0xb:
    pcVar9 = "starts-with";
    sVar8 = 0xb;
    goto LAB_001a8b89;
  case 0xc:
    pcVar9 = "derived-from";
    sVar8 = 0xc;
    goto LAB_001a8b89;
  case 0xd:
    iVar4 = strncmp(pcVar6 + uVar11,"namespace-uri",0xd);
    local_50 = 1;
    local_54 = 0;
    if (iVar4 != 0) {
      pcVar9 = "string-length";
      sVar8 = 0xd;
LAB_001a8970:
      local_48 = pcVar6 + uVar11;
      local_50 = 1;
      local_54 = 0;
      iVar4 = strncmp(local_48,pcVar9,sVar8);
      goto LAB_001a897a;
    }
    break;
  default:
    goto switchD_001a8698_caseD_e;
  case 0xf:
    iVar4 = strncmp(pcVar6 + uVar11,"normalize-space",0xf);
    if (iVar4 == 0) goto LAB_001a8bd5;
    pcVar9 = "substring-after";
    sVar8 = 0xf;
    goto LAB_001a8b89;
  case 0x10:
    pcVar9 = "substring-before";
    sVar8 = 0x10;
    goto LAB_001a8b89;
  case 0x14:
    pcVar9 = "derived-from-or-self";
    sVar8 = 0x14;
LAB_001a8b89:
    iVar4 = strncmp(pcVar6 + uVar11,pcVar9,sVar8);
    if (iVar4 != 0) {
switchD_001a8698_caseD_e:
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unknown XPath function \"%.*s\".",(ulong)uVar5,
              pcVar6 + uVar11);
      return LY_EINVAL;
    }
LAB_001a8bc8:
    local_54 = 2;
    local_50 = 2;
  }
  *tok_idx = uVar7 + 1;
  LVar3 = lyxp_check_token(ctx,exp,uVar7 + 1,LYXP_TOKEN_PAR1);
  if (LVar3 == LY_SUCCESS) {
    uVar5 = *tok_idx + 1;
    *tok_idx = uVar5;
    if (exp->used == uVar5) {
      LVar3 = LY_EINCOMPLETE;
LAB_001a858d:
      if (ctx != (ly_ctx *)0x0) {
        ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath expression end.");
      }
    }
    else {
      uVar10 = 0;
      if (exp->tokens[uVar5] != LYXP_TOKEN_PAR2) {
        LVar3 = reparse_or_expr(ctx,exp,tok_idx,depth);
        if (LVar3 != LY_SUCCESS) {
          return LVar3;
        }
        uVar10 = 1;
      }
      do {
        uVar5 = *tok_idx;
        if ((exp->used == uVar5) || (exp->tokens[uVar5] != LYXP_TOKEN_COMMA)) {
          LVar3 = lyxp_check_token(ctx,exp,uVar5,LYXP_TOKEN_PAR2);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          *tok_idx = *tok_idx + 1;
          if (uVar10 < local_54 || local_50 < uVar10) {
            ly_vlog(ctx,(char *)0x0,LYVE_XPATH,
                    "Invalid number of arguments (%u) for the XPath function %.*s.",(ulong)uVar10,
                    (ulong)exp->tok_len[uVar7],exp->expr + exp->tok_pos[uVar7]);
            return LY_EVALID;
          }
          goto LAB_001a873f;
        }
        *tok_idx = uVar5 + 1;
        uVar10 = uVar10 + 1;
        LVar3 = reparse_or_expr(ctx,exp,tok_idx,depth);
      } while (LVar3 == LY_SUCCESS);
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
reparse_path_expr(const struct ly_ctx *ctx, struct lyxp_expr *exp, uint32_t *tok_idx, uint32_t depth)
{
    LY_ERR rc;

    if (lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_NONE)) {
        return LY_EVALID;
    }

    switch (exp->tokens[*tok_idx]) {
    case LYXP_TOKEN_PAR1:
        /* '(' Expr ')' Predicate* */
        ++(*tok_idx);

        rc = reparse_or_expr(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);

        rc = lyxp_check_token(ctx, exp, *tok_idx, LYXP_TOKEN_PAR2);
        LY_CHECK_RET(rc);
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_DOT:
    case LYXP_TOKEN_DDOT:
    case LYXP_TOKEN_AXISNAME:
    case LYXP_TOKEN_AT:
    case LYXP_TOKEN_NAMETEST:
    case LYXP_TOKEN_NODETYPE:
        /* RelativeLocationPath */
        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_VARREF:
        /* VariableReference */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_FUNCNAME:
        /* FunctionCall */
        rc = reparse_function_call(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        goto predicate;
    case LYXP_TOKEN_OPER_PATH:
    case LYXP_TOKEN_OPER_RPATH:
        /* AbsoluteLocationPath */
        rc = reparse_absolute_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
        break;
    case LYXP_TOKEN_LITERAL:
        /* Literal */
        ++(*tok_idx);
        goto predicate;
    case LYXP_TOKEN_NUMBER:
        /* Number */
        ++(*tok_idx);
        goto predicate;
    default:
        LOGVAL(ctx, LY_VCODE_XP_INTOK, lyxp_token2str(exp->tokens[*tok_idx]), &exp->expr[exp->tok_pos[*tok_idx]]);
        return LY_EVALID;
    }

    return LY_SUCCESS;

predicate:
    /* Predicate* */
    while (!lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_BRACK1)) {
        rc = reparse_predicate(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    /* ('/' or '//') RelativeLocationPath */
    if (!exp_check_token2(NULL, exp, *tok_idx, LYXP_TOKEN_OPER_PATH, LYXP_TOKEN_OPER_RPATH)) {

        /* '/' or '//' */
        ++(*tok_idx);

        rc = reparse_relative_location_path(ctx, exp, tok_idx, depth);
        LY_CHECK_RET(rc);
    }

    return LY_SUCCESS;
}